

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool rcg::loadStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  long lVar1;
  CFeatureBag bag;
  ifstream in;
  undefined1 auStack_238 [8];
  CFeatureBag local_230 [16];
  long local_220 [3];
  undefined4 auStack_204 [123];
  
  GenApi_3_4::CFeatureBag::CFeatureBag(local_230);
  std::ifstream::ifstream(local_220);
  lVar1 = *(long *)(local_220[0] + -0x18);
  *(undefined4 *)((long)auStack_204 + lVar1) = 5;
  std::ios::clear((int)auStack_238 + (int)lVar1 + 0x18);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)name);
  GenApi_3_4::operator>>((istream *)local_220,local_230);
  std::ifstream::close();
  GenApi_3_4::CFeatureBag::LoadFromBag
            ((INodeMap *)local_230,
             SUB81((((nodemap->
                     super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,0),
             (gcstring_vector *)0x1);
  std::ifstream::~ifstream(local_220);
  GenApi_3_4::CFeatureBag::~CFeatureBag(local_230);
  return true;
}

Assistant:

bool loadStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    in.open(name);
    in >> bag;
    in.close();

    bag.LoadFromBag(nodemap->_Ptr, true);

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}